

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O1

lgx_rb_node_t * lgx_rb_get_greater(lgx_rb_t *rbt,lgx_str_t *key)

{
  int iVar1;
  long lVar2;
  lgx_rb_node_t *plVar3;
  lgx_rb_node_t *plVar4;
  
  plVar3 = rbt->root;
  if (plVar3 == (lgx_rb_node_t *)0x0) {
    plVar4 = (lgx_rb_node_t *)0x0;
  }
  else {
    plVar4 = (lgx_rb_node_t *)0x0;
    do {
      if (rbt->key_type == LGX_RB_KEY_INTEGER) {
        lVar2 = *(long *)(plVar3->key).buffer - *(long *)key->buffer;
      }
      else {
        iVar1 = lgx_str_cmp(&plVar3->key,key);
        lVar2 = (long)iVar1;
      }
      if (0 < lVar2) {
        plVar4 = plVar3;
      }
      plVar3 = (&plVar3->left)[lVar2 < 1];
    } while (plVar3 != (lgx_rb_node_s *)0x0);
  }
  return plVar4;
}

Assistant:

lgx_rb_node_t * lgx_rb_get_greater(lgx_rb_t *rbt, lgx_str_t *key) {
    lgx_rb_node_t *node, *ret = NULL;
    
    node = rbt->root;
    
    while(node) {
        if(rb_compare(rbt, &node->key, key) > 0) {
            ret = node;
            node = node->left;
        } else {
            node = node->right;
        }
    }
    
    return ret;
}